

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

void __thiscall Memory::HeapBlockMap32::~HeapBlockMap32(HeapBlockMap32 *this)

{
  L2MapChunk *obj;
  HeapAllocator *allocator;
  L2MapChunk *chunk;
  uint i;
  HeapBlockMap32 *this_local;
  
  for (chunk._4_4_ = 0; chunk._4_4_ < 0x1000; chunk._4_4_ = chunk._4_4_ + 1) {
    obj = this->map[chunk._4_4_];
    if (obj != (L2MapChunk *)0x0) {
      allocator = HeapAllocator::GetNoMemProtectInstance();
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::HeapBlockMap32::L2MapChunk>
                (allocator,obj);
    }
  }
  return;
}

Assistant:

HeapBlockMap32::~HeapBlockMap32()
{
    for (uint i = 0; i < _countof(map); i++)
    {
        L2MapChunk * chunk = map[i];
        if (chunk)
        {
            NoMemProtectHeapDelete(chunk);
        }
    }
}